

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FuncflParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FuncflParameters> *this)

{
  ~SimpleTypeData(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}